

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PoolList.hpp
# Opt level: O3

void __thiscall
PoolList<Future<void>::Private::ThreadPool::ThreadContext>::~PoolList
          (PoolList<Future<void>::Private::ThreadPool::ThreadContext> *this)

{
  ItemBlock *pIVar1;
  ItemBlock *pIVar2;
  Item *pIVar3;
  
  for (pIVar3 = (this->_begin).item; pIVar3 != &this->endItem; pIVar3 = pIVar3->next) {
    Thread::~Thread((Thread *)(pIVar3 + 1));
  }
  pIVar2 = this->blocks;
  while (pIVar2 != (ItemBlock *)0x0) {
    pIVar1 = pIVar2->next;
    operator_delete__(pIVar2);
    pIVar2 = pIVar1;
  }
  return;
}

Assistant:

~PoolList()
  {
    for(Item* i = _begin.item, * end = &endItem; i != end; i = i->next)
      ((T*)(i + 1))->~T();
    for(ItemBlock* i = blocks, * next; i; i = next)
    {
      next = i->next;
      delete[] (char*)i;
    }
  }